

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::IsEntryForFieldNumTest_Matcher_Test::TestBody
          (IsEntryForFieldNumTest_Matcher_Test *this)

{
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  matcher;
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  matcher_00;
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  m;
  NotMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  matcher_01;
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  m_00;
  NotMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  matcher_02;
  bool bVar1;
  int *gmock_p2;
  char *message;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined4 in_stack_fffffffffffffce4;
  undefined1 *local_268;
  FastFieldEntry *local_250;
  AssertHelper local_248;
  Message local_240;
  undefined8 local_238;
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  local_230;
  undefined8 uStack_210;
  undefined8 local_208;
  char local_200 [24];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  Message local_1d0;
  reference local_1c8;
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  local_1c0;
  undefined8 uStack_1a0;
  undefined8 local_198;
  char local_190 [24];
  undefined1 local_178 [8];
  AssertionResult gtest_ar_2;
  Message local_160;
  reference local_158;
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  local_150;
  char local_138 [24];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108 [3];
  reference local_f0;
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  local_e8;
  char local_d0 [24];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  array<google::protobuf::internal::TcParseTableBase::FieldEntry,_3UL> *entries;
  undefined8 local_98;
  int table_field_numbers [3];
  TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL> table;
  IsEntryForFieldNumTest_Matcher_Test *this_local;
  
  gmock_p2 = (int *)0x0;
  uVar2 = 0;
  uVar3 = 0;
  table._112_8_ = this;
  TcParseTableBase::TcParseTableBase
            ((TcParseTableBase *)(table_field_numbers + 2),0,0,0,'\0',0x48,0xfffffff8,0x70,0,0,0,
             (ClassData *)0x0,(PostLoopHandler)0x0,(TailCallParseFunc)0x0);
  local_250 = (FastFieldEntry *)&table.header.fallback;
  do {
    memset(local_250,0,0x10);
    TcParseTableBase::FastFieldEntry::FastFieldEntry(local_250);
    local_250 = local_250 + 1;
  } while (local_250 != (FastFieldEntry *)&table.fast_entries._M_elems[0].bits);
  memset(&table.fast_entries._M_elems[0].bits,0,4);
  local_268 = (undefined1 *)((long)&table.fast_entries._M_elems[0].bits.field_0 + 4);
  memset(local_268,0,0x24);
  do {
    local_268 = local_268 + 0xc;
  } while ((int32_t *)local_268 != &table.field_entries._M_elems[2].has_idx);
  table.field_entries._M_elems[2].has_idx._0_1_ = 0;
  local_98 = 0x200000001;
  table_field_numbers[0] = 3;
  table.fast_entries._M_elems[0].bits.field_0.data._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)&table.fast_entries._M_elems[0].bits.field_0 + 4);
  internal::(anonymous_namespace)::
  IsEntryForFieldNum<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>
            (&local_e8,(_anonymous_namespace_ *)(table_field_numbers + 2),
             (TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL> *)0x1,(int)&local_98,gmock_p2);
  matcher.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._0_2_ =
       (short)local_e8.
              super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
              .params_.
              super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
              .
              super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
              ._M_head_impl;
  matcher.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Tuple_impl<2UL,_int_*>.
  super__Head_base<2UL,_int_*,_false>._M_head_impl =
       (_Head_base<2UL,_int_*,_false>)
       (_Head_base<2UL,_int_*,_false>)
       local_e8.
       super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
       .params_.
       super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
       .super__Tuple_impl<1UL,_int,_int_*>._8_8_;
  matcher.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._2_2_ =
       (short)((ulong)local_e8.
                      super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
                      .params_.
                      super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
                      .
                      super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
                      ._M_head_impl >> 0x10);
  matcher.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>._12_4_ =
       (int)((ulong)local_e8.
                    super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
                    .params_.
                    super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
                    .
                    super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
                    ._M_head_impl >> 0x20);
  matcher.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._0_2_ = uVar2;
  matcher.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._2_2_ = uVar3;
  matcher.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._4_4_ = in_stack_fffffffffffffce4;
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
            (matcher);
  local_f0 = std::array<google::protobuf::internal::TcParseTableBase::FieldEntry,_3UL>::operator[]
                       ((array<google::protobuf::internal::TcParseTableBase::FieldEntry,_3UL> *)
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,0);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
  ::operator()((AssertionResult *)local_b8,local_d0,(FieldEntry **)"&entries[0]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_108);
    gmock_p2 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x136,(char *)gmock_p2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  internal::(anonymous_namespace)::
  IsEntryForFieldNum<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>
            (&local_150,(_anonymous_namespace_ *)(table_field_numbers + 2),
             (TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL> *)0x3,(int)&local_98,gmock_p2);
  matcher_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._0_2_ =
       (short)local_150.
              super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
              .params_.
              super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
              .
              super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
              ._M_head_impl;
  matcher_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Tuple_impl<2UL,_int_*>.
  super__Head_base<2UL,_int_*,_false>._M_head_impl =
       (_Head_base<2UL,_int_*,_false>)
       (_Head_base<2UL,_int_*,_false>)
       local_150.
       super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
       .params_.
       super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
       .super__Tuple_impl<1UL,_int,_int_*>._8_8_;
  matcher_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._2_2_ =
       (short)((ulong)local_150.
                      super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
                      .params_.
                      super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
                      .
                      super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
                      ._M_head_impl >> 0x10);
  matcher_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>._12_4_ =
       (int)((ulong)local_150.
                    super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
                    .params_.
                    super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
                    .
                    super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
                    ._M_head_impl >> 0x20);
  matcher_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._0_2_ = uVar2;
  matcher_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._2_2_ = uVar3;
  matcher_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._4_4_ = in_stack_fffffffffffffce4;
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
            (matcher_00);
  local_158 = std::array<google::protobuf::internal::TcParseTableBase::FieldEntry,_3UL>::operator[]
                        ((array<google::protobuf::internal::TcParseTableBase::FieldEntry,_3UL> *)
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,2);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
  ::operator()((AssertionResult *)local_120,local_138,(FieldEntry **)"&entries[2]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    gmock_p2 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x137,(char *)gmock_p2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  internal::(anonymous_namespace)::
  IsEntryForFieldNum<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>
            (&local_1c0,(_anonymous_namespace_ *)(table_field_numbers + 2),
             (TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL> *)0x3,(int)&local_98,gmock_p2);
  m.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._0_2_ =
       (short)local_1c0.
              super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
              .params_.
              super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
              .
              super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
              ._M_head_impl;
  m.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Tuple_impl<2UL,_int_*>.
  super__Head_base<2UL,_int_*,_false>._M_head_impl =
       (_Head_base<2UL,_int_*,_false>)
       (_Head_base<2UL,_int_*,_false>)
       local_1c0.
       super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
       .params_.
       super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
       .super__Tuple_impl<1UL,_int,_int_*>._8_8_;
  m.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._2_2_ =
       (short)((ulong)local_1c0.
                      super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
                      .params_.
                      super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
                      .
                      super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
                      ._M_head_impl >> 0x10);
  m.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>._12_4_ =
       (int)((ulong)local_1c0.
                    super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
                    .params_.
                    super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
                    .
                    super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
                    ._M_head_impl >> 0x20);
  m.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._0_2_ = uVar2;
  m.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._2_2_ = uVar3;
  m.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._4_4_ = in_stack_fffffffffffffce4;
  testing::
  Not<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
            (m);
  matcher_01.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._0_2_ =
       (short)local_198;
  matcher_01.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Tuple_impl<2UL,_int_*>.
  super__Head_base<2UL,_int_*,_false>._M_head_impl =
       (_Head_base<2UL,_int_*,_false>)(_Head_base<2UL,_int_*,_false>)uStack_1a0;
  matcher_01.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._2_2_ =
       (short)((ulong)local_198 >> 0x10);
  matcher_01.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>._12_4_ = (int)((ulong)local_198 >> 0x20);
  matcher_01.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._0_2_ = uVar2;
  matcher_01.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._2_2_ = uVar3;
  matcher_01.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._4_4_ = in_stack_fffffffffffffce4;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>>
            (matcher_01);
  local_1c8 = std::array<google::protobuf::internal::TcParseTableBase::FieldEntry,_3UL>::operator[]
                        ((array<google::protobuf::internal::TcParseTableBase::FieldEntry,_3UL> *)
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,1);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>>
  ::operator()((AssertionResult *)local_178,local_190,(FieldEntry **)"&entries[1]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    gmock_p2 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x139,(char *)gmock_p2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  internal::(anonymous_namespace)::
  IsEntryForFieldNum<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>
            (&local_230,(_anonymous_namespace_ *)(table_field_numbers + 2),
             (TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL> *)0x1,(int)&local_98,gmock_p2);
  m_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._0_2_ =
       (short)local_230.
              super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
              .params_.
              super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
              .
              super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
              ._M_head_impl;
  m_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Tuple_impl<2UL,_int_*>.
  super__Head_base<2UL,_int_*,_false>._M_head_impl =
       (_Head_base<2UL,_int_*,_false>)
       (_Head_base<2UL,_int_*,_false>)
       local_230.
       super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
       .params_.
       super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
       .super__Tuple_impl<1UL,_int,_int_*>._8_8_;
  m_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._2_2_ =
       (short)((ulong)local_230.
                      super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
                      .params_.
                      super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
                      .
                      super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
                      ._M_head_impl >> 0x10);
  m_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>._12_4_ =
       (int)((ulong)local_230.
                    super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
                    .params_.
                    super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
                    .
                    super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
                    ._M_head_impl >> 0x20);
  m_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._0_2_ = uVar2;
  m_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._2_2_ = uVar3;
  m_00.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._4_4_ = in_stack_fffffffffffffce4;
  testing::
  Not<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
            (m_00);
  matcher_02.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._0_2_ =
       (short)local_208;
  matcher_02.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Tuple_impl<2UL,_int_*>.
  super__Head_base<2UL,_int_*,_false>._M_head_impl =
       (_Head_base<2UL,_int_*,_false>)(_Head_base<2UL,_int_*,_false>)uStack_210;
  matcher_02.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>.super__Head_base<1UL,_int,_false>._M_head_impl._2_2_ =
       (short)((ulong)local_208 >> 0x10);
  matcher_02.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Tuple_impl<1UL,_int,_int_*>._12_4_ = (int)((ulong)local_208 >> 0x20);
  matcher_02.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._0_2_ = uVar2;
  matcher_02.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._2_2_ = uVar3;
  matcher_02.matcher_.
  super_MatcherBaseImpl<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>_>
  .params_.
  super__Tuple_impl<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  .super__Head_base<0UL,_google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_false>
  ._M_head_impl._4_4_ = in_stack_fffffffffffffce4;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>>
            (matcher_02);
  local_238 = 0;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>>
  ::operator()((AssertionResult *)local_1e8,local_200,(void **)0x1f9f320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x13b,message);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  return;
}

Assistant:

TEST(IsEntryForFieldNumTest, Matcher) {
  // clang-format off
  TcParseTable<0, 3, 0, 0, 2> table = {
      // header:
      {
          0, 0,  // has_bits_offset, extensions
          0,     // max_field_number
          0,     // fast_idx_mask,
          offsetof(decltype(table), field_lookup_table),
          0xFFFFFFFF - 7,  // 7 = fields 1, 2, and 3.
          offsetof(decltype(table), field_names),
          0,           // num_field_entries
          0, 0,        // num_aux_entries, aux_offset,
          nullptr,     // default instance
          nullptr,     // post_loop_handler
          nullptr,     // fallback function
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          nullptr,     // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
      }};
  // clang-format on
  int table_field_numbers[] = {1, 2, 3};
  table.field_lookup_table = {{65535, 65535}};

  auto& entries = table.field_entries;
  EXPECT_THAT(&entries[0], IsEntryForFieldNum(&table, 1, table_field_numbers));
  EXPECT_THAT(&entries[2], IsEntryForFieldNum(&table, 3, table_field_numbers));
  EXPECT_THAT(&entries[1],
              Not(IsEntryForFieldNum(&table, 3, table_field_numbers)));

  EXPECT_THAT(nullptr, Not(IsEntryForFieldNum(&table, 1, table_field_numbers)));
}